

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O1

bool __thiscall S2Polygon::FindLoopNestingError(S2Polygon *this,S2Error *error)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  pointer puVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  bool local_41;
  
  puVar5 = (this->loops_).
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar4 = (int)((ulong)((long)(this->loops_).
                              super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5) >> 3);
  bVar2 = 0 < iVar4;
  if (0 < iVar4) {
    uVar8 = 0;
    iVar4 = -1;
    do {
      iVar1 = *(int *)((long)puVar5[uVar8]._M_t.
                             super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t + 8);
      if (iVar4 + 1 < iVar1 || iVar1 < 0) {
        S2Error::Init(error,POLYGON_INVALID_LOOP_DEPTH,"Loop %d: invalid loop depth (%d)",
                      uVar8 & 0xffffffff);
        if (bVar2) {
          return true;
        }
        break;
      }
      uVar8 = uVar8 + 1;
      puVar5 = (this->loops_).
               super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = (long)(int)((ulong)((long)(this->loops_).
                                        super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5)
                         >> 3);
      bVar2 = (long)uVar8 < lVar6;
      iVar4 = iVar1;
    } while ((long)uVar8 < lVar6);
  }
  iVar4 = (int)((ulong)((long)(this->loops_).
                              super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->loops_).
                             super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_41 = 0 < iVar4;
  if (0 < iVar4) {
    uVar8 = 0;
    do {
      puVar5 = (this->loops_).
               super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar4 = (int)((ulong)((long)(this->loops_).
                                  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5) >> 3);
      bVar2 = 0 < iVar4;
      if (0 < iVar4) {
        iVar4 = GetLastDescendant(this,(int)uVar8);
        uVar9 = 0;
        do {
          if (uVar8 != uVar9) {
            bVar3 = S2Loop::ContainsNonCrossingBoundary
                              ((S2Loop *)
                               puVar5[uVar8]._M_t.
                               super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t,
                               (S2Loop *)
                               puVar5[uVar9]._M_t.
                               super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t,
                               false);
            if (((long)uVar9 <= (long)iVar4 && uVar8 < uVar9) != bVar3) {
              pcVar7 = "not ";
              if ((long)uVar9 <= (long)iVar4 && uVar8 < uVar9) {
                pcVar7 = "";
              }
              S2Error::Init(error,POLYGON_INVALID_LOOP_NESTING,
                            "Invalid nesting: loop %d should %scontain loop %d",uVar8 & 0xffffffff,
                            pcVar7,uVar9 & 0xffffffff);
              if (bVar2) {
                return local_41;
              }
              break;
            }
          }
          uVar9 = uVar9 + 1;
          puVar5 = (this->loops_).
                   super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar6 = (long)(int)((ulong)((long)(this->loops_).
                                            super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)puVar5) >> 3);
          bVar2 = (long)uVar9 < lVar6;
        } while ((long)uVar9 < lVar6);
      }
      uVar8 = uVar8 + 1;
      lVar6 = (long)(int)((ulong)((long)(this->loops_).
                                        super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->loops_).
                                       super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3);
      local_41 = (long)uVar8 < lVar6;
    } while ((long)uVar8 < lVar6);
  }
  return local_41;
}

Assistant:

bool S2Polygon::FindLoopNestingError(S2Error* error) const {
  // First check that the loop depths make sense.
  for (int last_depth = -1, i = 0; i < num_loops(); ++i) {
    int depth = loop(i)->depth();
    if (depth < 0 || depth > last_depth + 1) {
      error->Init(S2Error::POLYGON_INVALID_LOOP_DEPTH,
                  "Loop %d: invalid loop depth (%d)", i, depth);
      return true;
    }
    last_depth = depth;
  }
  // Then check that they correspond to the actual loop nesting.  This test
  // is quadratic in the number of loops but the cost per iteration is small.
  for (int i = 0; i < num_loops(); ++i) {
    int last = GetLastDescendant(i);
    for (int j = 0; j < num_loops(); ++j) {
      if (i == j) continue;
      bool nested = (j >= i + 1) && (j <= last);
      const bool reverse_b = false;
      if (loop(i)->ContainsNonCrossingBoundary(loop(j), reverse_b) != nested) {
        error->Init(S2Error::POLYGON_INVALID_LOOP_NESTING,
                    "Invalid nesting: loop %d should %scontain loop %d",
                    i, nested ? "" : "not ", j);
        return true;
      }
    }
  }
  return false;
}